

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O1

int __thiscall
cmsys::RegExpFind::regtry(RegExpFind *this,char *string,char **start,char **end,char *prog)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  
  this->reginput = string;
  this->regstartp = start;
  this->regendp = end;
  uVar1 = 0xb;
  lVar3 = 0;
  do {
    *(undefined8 *)((long)start + lVar3) = 0;
    *(undefined8 *)((long)end + lVar3) = 0;
    lVar3 = lVar3 + 8;
    uVar1 = uVar1 - 1;
  } while (1 < uVar1);
  iVar2 = regmatch(this,prog + 1);
  if (iVar2 != 0) {
    *start = string;
    *end = this->reginput;
  }
  return (uint)(iVar2 != 0);
}

Assistant:

int RegExpFind::regtry(const char* string, const char** start,
                       const char** end, const char* prog)
{
  int i;
  const char** sp1;
  const char** ep;

  reginput = string;
  regstartp = start;
  regendp = end;

  sp1 = start;
  ep = end;
  for (i = RegularExpressionMatch::NSUBEXP; i > 0; i--) {
    *sp1++ = nullptr;
    *ep++ = nullptr;
  }
  if (regmatch(prog + 1)) {
    start[0] = string;
    end[0] = reginput;
    return (1);
  } else
    return (0);
}